

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_print_objects(ggml_context *ctx)

{
  ggml_object *obj;
  
  obj = ctx->objects_begin;
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: objects in context %p:\n","ggml_print_objects",ctx);
  for (; obj != (ggml_object *)0x0; obj = obj->next) {
    ggml_print_object(obj);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: --- end ---\n","ggml_print_objects");
  return;
}

Assistant:

void ggml_print_objects(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    GGML_LOG_INFO("%s: objects in context %p:\n", __func__, (const void *) ctx);

    while (obj != NULL) {
        ggml_print_object(obj);
        obj = obj->next;
    }

    GGML_LOG_INFO("%s: --- end ---\n", __func__);
}